

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O0

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 Distributions::toCDF(vector<double,_std::allocator<double>_> *distribution)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  __uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
  in_RDI;
  uint i;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  pointer in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff58;
  value_type_conflict4 *in_stack_ffffffffffffff60;
  value_type vVar5;
  size_type in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  undefined4 local_40;
  
  operator_new(0x18);
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::allocator<double>::allocator((allocator<double> *)0x2a3228);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::
  unique_ptr<std::vector<double,std::allocator<double>>,std::default_delete<std::vector<double,std::allocator<double>>>>
  ::unique_ptr<std::default_delete<std::vector<double,std::allocator<double>>>,void>
            ((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<double>::~allocator((allocator<double> *)0x2a326a);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar1 != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    vVar5 = *pvVar2;
    std::
    unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
    ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                  *)0x2a32f8);
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    *pvVar3 = vVar5;
    local_40 = 1;
    while( true ) {
      uVar4 = (ulong)local_40;
      sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      if (sVar1 <= uVar4) break;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)local_40);
      vVar5 = *pvVar2;
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a3371);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = (vector<double,_std::allocator<double>_> *)(vVar5 + *pvVar3);
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a33ab);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      *pvVar3 = (value_type)in_stack_ffffffffffffff50;
      local_40 = local_40 + 1;
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(tuple<std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>.
             _M_head_impl;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(0) = distribution[0];
	for (unsigned int i=1; i<distribution.size(); ++i) {
		result->at(i) = distribution[i] + result->at(i-1);
	}
	return result;
}